

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf.c
# Opt level: O1

int mbedtls_hkdf_expand(mbedtls_md_info_t *md,uchar *prk,size_t prk_len,uchar *info,size_t info_len,
                       uchar *okm,size_t okm_len)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  mbedtls_md_context_t ctx;
  uchar t [64];
  uchar local_c9;
  long local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  uchar *local_a8;
  uchar *local_a0;
  uchar *local_98;
  mbedtls_md_context_t local_90;
  uchar local_78 [72];
  
  iVar4 = -0x5f80;
  if (okm != (uchar *)0x0) {
    local_a0 = okm;
    local_98 = prk;
    bVar3 = mbedtls_md_get_size(md);
    local_c0 = (size_t)bVar3;
    if (bVar3 != 0 && local_c0 <= prk_len) {
      if (info == (uchar *)0x0) {
        info_len = 0;
      }
      local_a8 = "";
      if (info != (uchar *)0x0) {
        local_a8 = info;
      }
      uVar7 = (ulong)(okm_len % local_c0 == 0);
      uVar1 = okm_len / local_c0 + 1;
      uVar6 = uVar1 - uVar7;
      if (uVar6 < 0x100) {
        local_b0 = info_len;
        mbedtls_md_init(&local_90);
        iVar4 = mbedtls_md_setup(&local_90,md,1);
        if (iVar4 == 0) {
          if (uVar1 == uVar7) {
            iVar4 = 0;
          }
          else {
            local_b8 = 0;
            local_c8 = 0;
            uVar7 = 1;
            do {
              local_c9 = (uchar)uVar7;
              iVar4 = mbedtls_md_hmac_starts(&local_90,local_98,prk_len);
              if ((((iVar4 == 0) &&
                   (iVar4 = mbedtls_md_hmac_update(&local_90,local_78,local_b8), iVar4 == 0)) &&
                  (iVar4 = mbedtls_md_hmac_update(&local_90,local_a8,local_b0), iVar4 == 0)) &&
                 (iVar4 = mbedtls_md_hmac_update(&local_90,&local_c9,1), iVar4 == 0)) {
                iVar5 = mbedtls_md_hmac_finish(&local_90,local_78);
                lVar2 = local_c8;
                iVar4 = 0;
                if (iVar5 == 0) {
                  __n = okm_len - local_c8;
                  if (uVar6 != uVar7) {
                    __n = local_c0;
                  }
                  memcpy(local_a0 + local_c8,local_78,__n);
                  local_b8 = local_c0;
                  local_c8 = lVar2 + local_c0;
                  bVar8 = true;
                }
                else {
                  bVar8 = false;
                  iVar4 = iVar5;
                }
              }
              else {
                bVar8 = false;
              }
            } while ((bVar8) && (bVar8 = uVar7 < uVar6, uVar7 = uVar7 + 1, bVar8));
          }
        }
        mbedtls_md_free(&local_90);
        mbedtls_platform_zeroize(local_78,0x40);
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_hkdf_expand( const mbedtls_md_info_t *md, const unsigned char *prk,
                         size_t prk_len, const unsigned char *info,
                         size_t info_len, unsigned char *okm, size_t okm_len )
{
    size_t hash_len;
    size_t where = 0;
    size_t n;
    size_t t_len = 0;
    size_t i;
    int ret = 0;
    mbedtls_md_context_t ctx;
    unsigned char t[MBEDTLS_MD_MAX_SIZE];

    if( okm == NULL )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    hash_len = mbedtls_md_get_size( md );

    if( prk_len < hash_len || hash_len == 0 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    if( info == NULL )
    {
        info = (const unsigned char *) "";
        info_len = 0;
    }

    n = okm_len / hash_len;

    if( (okm_len % hash_len) != 0 )
    {
        n++;
    }

    /*
     * Per RFC 5869 Section 2.3, okm_len must not exceed
     * 255 times the hash length
     */
    if( n > 255 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    mbedtls_md_init( &ctx );

    if( (ret = mbedtls_md_setup( &ctx, md, 1) ) != 0 )
    {
        goto exit;
    }

    /*
     * Compute T = T(1) | T(2) | T(3) | ... | T(N)
     * Where T(N) is defined in RFC 5869 Section 2.3
     */
    for( i = 1; i <= n; i++ )
    {
        size_t num_to_copy;
        unsigned char c = i & 0xff;

        ret = mbedtls_md_hmac_starts( &ctx, prk, prk_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, t, t_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, info, info_len );
        if( ret != 0 )
        {
            goto exit;
        }

        /* The constant concatenated to the end of each T(n) is a single octet.
         * */
        ret = mbedtls_md_hmac_update( &ctx, &c, 1 );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_finish( &ctx, t );
        if( ret != 0 )
        {
            goto exit;
        }

        num_to_copy = i != n ? hash_len : okm_len - where;
        memcpy( okm + where, t, num_to_copy );
        where += hash_len;
        t_len = hash_len;
    }

exit:
    mbedtls_md_free( &ctx );
    mbedtls_platform_zeroize( t, sizeof( t ) );

    return( ret );
}